

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O3

void __thiscall simple_thread_pool::ThreadPoolMgr::checkThreadAndInvoke(ThreadPoolMgr *this)

{
  byte bVar1;
  int iVar2;
  pthread_t in_RAX;
  iterator iVar3;
  long in_FS_OFFSET;
  id tid;
  key_type local_18;
  
  bVar1 = *(byte *)(in_FS_OFFSET + -0x30);
  local_18._M_thread = in_RAX;
  if (bVar1 == 0) {
    local_18._M_thread = pthread_self();
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->threadIdsLock);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    iVar3 = std::
            _Hashtable<std::thread::id,_std::pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_std::allocator<std::pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>,_std::__detail::_Select1st,_std::equal_to<std::thread::id>,_std::hash<std::thread::id>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->threadIds)._M_h,&local_18);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::thread::id,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      *(undefined1 *)(in_FS_OFFSET + -0x2f) = 1;
    }
    *(undefined1 *)(in_FS_OFFSET + -0x30) = 1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->threadIdsLock);
    bVar1 = *(byte *)(in_FS_OFFSET + -0x30);
  }
  if ((((bVar1 & 1) == 0) || (*(char *)(in_FS_OFFSET + -0x2f) != '\x01')) ||
     ((this->myOpt).activeWorkerMode == false)) {
    (*(this->super_ThreadPoolMgrBase)._vptr_ThreadPoolMgrBase[1])(this);
  }
  return;
}

Assistant:

void checkThreadAndInvoke() {
        // `true` if `is_this_thread_worker` has valid value.
        thread_local bool this_thread_is_identified = false;

        // `true` if this thread is the worker of the thread pool.
        thread_local bool this_thread_is_worker = false;

        if (!this_thread_is_identified) {
            std::thread::id tid = std::this_thread::get_id();

            std::lock_guard<std::mutex> l(threadIdsLock);
            auto entry = threadIds.find(tid);
            if (entry != threadIds.end()) {
                this_thread_is_worker = true;
            }
            this_thread_is_identified = true;
        }

        if ( this_thread_is_identified &&
             this_thread_is_worker &&
             myOpt.activeWorkerMode ) {
            // This is worker thread and in active mode.
            // We don't need to invoke thread loop,
            // as the worker's loop will serve the next task immediately.
        } else {
            // Otherwise, invoke manager's loop.
            invoke();
        }
    }